

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall LinkedReadsDatastore::get_tag_readcount(LinkedReadsDatastore *this)

{
  bool bVar1;
  reference pvVar2;
  reference puVar3;
  uint *in_RSI;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  uint *t;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint32_t curr_count;
  value_type curr_tag;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *readcount;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__lhs;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  uint *local_28;
  int local_1c;
  value_type local_18;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x3c27fe);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x44),0);
  local_18 = *pvVar2;
  local_1c = 0;
  local_28 = in_RSI + 0x44;
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)__lhs,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)in_RDI), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_30);
    if (*puVar3 != local_18) {
      if (local_18 != 0) {
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<unsigned_int&,unsigned_int&>(in_stack_ffffffffffffffb0,in_RSI,(uint *)__lhs);
      }
      local_1c = 0;
      local_18 = *puVar3;
    }
    local_1c = local_1c + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_30);
  }
  if (local_18 != 0) {
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<unsigned_int&,unsigned_int&>(in_stack_ffffffffffffffb0,in_RSI,(uint *)__lhs);
  }
  return __lhs;
}

Assistant:

std::vector<std::pair<LinkedTag, uint32_t>> LinkedReadsDatastore::get_tag_readcount() {
    std::vector<std::pair<LinkedTag, uint32_t>> readcount;
    auto curr_tag=read_tag[0];
    uint32_t curr_count=0;
    for (auto &t:read_tag){
        if (t!=curr_tag){
            if (curr_tag!=0) readcount.emplace_back(curr_tag,curr_count);
            curr_count=0;
            curr_tag=t;
        }
        ++curr_count;
    }
    if (curr_tag!=0) readcount.emplace_back(curr_tag,curr_count);
    return readcount;
}